

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

void __thiscall cmFileAPI::cmFileAPI(cmFileAPI *this,cmake *cm)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  CharReader *pCVar3;
  StreamWriter *pSVar4;
  string *psVar5;
  Value *pVVar6;
  CharReader *pCVar7;
  StreamWriter *pSVar8;
  CharReaderBuilder rbuilder;
  StreamWriterBuilder wbuilder;
  undefined1 local_1f8 [16];
  _func_int *local_1e8 [4];
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  StreamWriterBuilder local_128;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  this->CMakeInstance = cm;
  (this->APIv1)._M_dataplus._M_p = (pointer)&(this->APIv1).field_2;
  (this->APIv1)._M_string_length = 0;
  (this->APIv1).field_2._M_local_buf[0] = '\0';
  (this->ReplyFiles)._M_h._M_buckets = &(this->ReplyFiles)._M_h._M_single_bucket;
  (this->ReplyFiles)._M_h._M_bucket_count = 1;
  (this->ReplyFiles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ReplyFiles)._M_h._M_element_count = 0;
  (this->ReplyFiles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->TopQuery).Known.super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TopQuery).Known.super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TopQuery).Known.super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TopQuery).Unknown.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TopQuery).Unknown.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TopQuery).Unknown.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->ClientQueries)._M_t._M_impl.super__Rb_tree_header;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ReplyFiles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ReplyFiles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->QueryExists = false;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->JsonWriter)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = (StreamWriter *)0x0;
  (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->JsonReader)._M_t.
  super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
  super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
  super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl = (CharReader *)0x0;
  psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(cm);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  local_1f8._0_8_ = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,pcVar2,pcVar2 + psVar5->_M_string_length);
  std::__cxx11::string::append(local_1f8);
  std::__cxx11::string::operator=((string *)&this->APIv1,(string *)local_1f8);
  if ((_func_int **)local_1f8._0_8_ != local_1e8) {
    operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8[0] + 1));
  }
  Json::CharReaderBuilder::CharReaderBuilder((CharReaderBuilder *)local_1f8);
  Json::Value::Value(&local_58,false);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"collectComments","");
  pVVar6 = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_1f8,&local_148);
  Json::Value::operator=(pVVar6,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_58);
  Json::Value::Value(&local_80,true);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"failIfExtra","");
  pVVar6 = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_1f8,&local_168);
  Json::Value::operator=(pVVar6,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_80);
  Json::Value::Value(&local_a8,false);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"rejectDupKeys","");
  pVVar6 = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_1f8,&local_188);
  Json::Value::operator=(pVVar6,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_a8);
  Json::Value::Value(&local_d0,true);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"strictRoot","");
  pVVar6 = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_1f8,&local_1a8);
  Json::Value::operator=(pVVar6,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_d0);
  pCVar7 = Json::CharReaderBuilder::newCharReader((CharReaderBuilder *)local_1f8);
  pCVar3 = (this->JsonReader)._M_t.
           super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
           super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
           super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl;
  (this->JsonReader)._M_t.
  super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
  super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
  super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl = pCVar7;
  if (pCVar3 != (CharReader *)0x0) {
    (*pCVar3->_vptr_CharReader[1])();
  }
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_128);
  Json::Value::Value(&local_f8,"\t");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"indentation","");
  pVVar6 = Json::StreamWriterBuilder::operator[](&local_128,&local_1c8);
  Json::Value::operator=(pVVar6,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_f8);
  pSVar8 = Json::StreamWriterBuilder::newStreamWriter(&local_128);
  pSVar4 = (this->JsonWriter)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  (this->JsonWriter)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = pSVar8;
  if (pSVar4 != (StreamWriter *)0x0) {
    (*pSVar4->_vptr_StreamWriter[1])();
  }
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_128);
  Json::CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)local_1f8);
  return;
}

Assistant:

cmFileAPI::cmFileAPI(cmake* cm)
  : CMakeInstance(cm)
{
  this->APIv1 =
    this->CMakeInstance->GetHomeOutputDirectory() + "/.cmake/api/v1";

  Json::CharReaderBuilder rbuilder;
  rbuilder["collectComments"] = false;
  rbuilder["failIfExtra"] = true;
  rbuilder["rejectDupKeys"] = false;
  rbuilder["strictRoot"] = true;
  this->JsonReader =
    std::unique_ptr<Json::CharReader>(rbuilder.newCharReader());

  Json::StreamWriterBuilder wbuilder;
  wbuilder["indentation"] = "\t";
  this->JsonWriter =
    std::unique_ptr<Json::StreamWriter>(wbuilder.newStreamWriter());
}